

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O3

string * __thiscall kratos::FSM::dot_graph_abi_cxx11_(string *__return_storage_ptr__,FSM *this)

{
  char *__s;
  undefined1 *puVar1;
  pointer *pppFVar2;
  FSMState *pFVar3;
  pointer ppVar4;
  Var *pVVar5;
  char cVar6;
  pointer ppFVar7;
  int iVar8;
  ostream *poVar9;
  size_t sVar10;
  long *plVar11;
  mapped_type *pmVar12;
  undefined1 auVar13 [8];
  size_type sVar14;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  undefined8 uVar15;
  pointer ppVar16;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  string_view format_str_03;
  string_view format_str_04;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  stringstream local_2f0 [8];
  stringstream stream;
  map<kratos::FSMState_*,_kratos::color::Color,_std::less<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_kratos::color::Color>_>_>
  state_colors;
  size_type local_128 [2];
  key_type *local_118;
  key_type *local_110;
  string *local_108;
  undefined1 local_100 [8];
  vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> states;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  ulong local_c8;
  size_type *local_b8;
  string start_state_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> color_str;
  pointer pcStack_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined1 auStack_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> color_str_1;
  char indent [5];
  
  color_str_1.field_2._M_local_buf[0xc] = '\0';
  color_str_1.field_2._8_4_ = 0x20202020;
  local_108 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_2f0);
  puVar1 = &stream.field_0x8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"digraph ",8);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(this->fsm_name_)._M_dataplus._M_p,
                      (this->fsm_name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," {",2);
  std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  sVar10 = strlen(color_str_1.field_2._M_local_buf + 8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,color_str_1.field_2._M_local_buf + 8,sVar10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"rankdir=LR;",0xb);
  std::ios::widen((char)*(undefined8 *)(stream._8_8_ + -0x18) + (char)puVar1);
  std::ostream::put((char)puVar1);
  plVar11 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
  std::ostream::put((char)plVar11);
  std::ostream::flush();
  local_b8 = &start_state_name._M_string_length;
  start_state_name._M_dataplus._M_p = (pointer)0x0;
  start_state_name._M_string_length._0_1_ = 0;
  pFVar3 = (this->start_state_).super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (pFVar3 != (FSMState *)0x0) {
    FSMState::handle_name_abi_cxx11_
              ((string *)
               &states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,pFVar3);
    std::__cxx11::string::operator=
              ((string *)&local_b8,
               (string *)
               &states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage != &local_d8) {
      operator_delete(states.
                      super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                      (ulong)(local_d8._M_allocated_capacity + 1));
    }
  }
  get_all_child_states
            ((vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *)local_100,this,true)
  ;
  get_state_color((map<kratos::FSMState_*,_kratos::color::Color,_std::less<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_kratos::color::Color>_>_>
                   *)&stream.field_0x180,
                  (vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *)local_100);
  if (start_state_name._M_dataplus._M_p != (pointer)0x0) {
    states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)(this->start_state_).
                  super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pmVar12 = std::
              map<kratos::FSMState_*,_kratos::color::Color,_std::less<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_kratos::color::Color>_>_>
              ::at((map<kratos::FSMState_*,_kratos::color::Color,_std::less<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_kratos::color::Color>_>_>
                    *)&stream.field_0x180,
                   (key_type *)
                   &states.
                    super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
    states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)(ulong)pmVar12->R;
    local_d8._M_allocated_capacity = (size_type)pmVar12->G;
    local_c8 = (ulong)pmVar12->B;
    format_str.size_ = 0x222;
    format_str.data_ = (char *)0x16;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)
             &states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)((long)&start_state_name.field_2 + 8),(detail *)"#{0:02X}{1:02X}{2:02X}",
               format_str,args);
    sVar10 = strlen(color_str_1.field_2._M_local_buf + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)puVar1,color_str_1.field_2._M_local_buf + 8,sVar10);
    FSMState::handle_name_abi_cxx11_
              ((string *)((long)&color_str.field_2 + 8),
               (this->start_state_).super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
    states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)color_str.field_2._8_8_;
    local_d8._M_allocated_capacity = start_state_name.field_2._8_8_;
    local_d8._8_8_ = color_str._M_dataplus._M_p;
    format_str_00.size_ = 0xdd;
    format_str_00.data_ = (char *)0x4a;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)
             &states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)auStack_58,
               (detail *)
               "node [shape=doublecircle, label=\"{0}\", style=filled, fillcolor=\"{1}\"] {0};",
               format_str_00,args_00);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar1,(char *)auStack_58,(long)color_str_1._M_dataplus._M_p);
    std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    if (auStack_58 != (undefined1  [8])&color_str_1._M_string_length) {
      operator_delete((void *)auStack_58,color_str_1._M_string_length + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)color_str.field_2._8_8_ != &local_68) {
      operator_delete((void *)color_str.field_2._8_8_,local_68._M_allocated_capacity + 1);
    }
    if ((size_type *)start_state_name.field_2._8_8_ != &color_str._M_string_length) {
      operator_delete((void *)start_state_name.field_2._8_8_,color_str._M_string_length + 1);
    }
  }
  ppFVar7 = states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (local_100 !=
      (undefined1  [8])
      states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pppFVar2 = &states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
    auVar13 = local_100;
    do {
      FSMState::handle_name_abi_cxx11_
                ((string *)((long)&start_state_name.field_2 + 8),*(FSMState **)auVar13);
      uVar15 = start_state_name.field_2._8_8_;
      if ((color_str._M_dataplus._M_p != start_state_name._M_dataplus._M_p) ||
         ((color_str._M_dataplus._M_p != (pointer)0x0 &&
          (iVar8 = bcmp((void *)start_state_name.field_2._8_8_,local_b8,
                        (size_t)color_str._M_dataplus._M_p), iVar8 != 0)))) {
        pmVar12 = std::
                  map<kratos::FSMState_*,_kratos::color::Color,_std::less<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_kratos::color::Color>_>_>
                  ::at((map<kratos::FSMState_*,_kratos::color::Color,_std::less<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_kratos::color::Color>_>_>
                        *)&stream.field_0x180,(key_type *)auVar13);
        states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)(ulong)pmVar12->R;
        local_d8._M_allocated_capacity = (size_type)pmVar12->G;
        local_c8 = (ulong)pmVar12->B;
        format_str_01.size_ = 0x222;
        format_str_01.data_ = (char *)0x16;
        args_01.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ = in_R9.values_;
        args_01.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)pppFVar2;
        fmt::v7::detail::vformat_abi_cxx11_
                  ((string *)auStack_58,(detail *)"#{0:02X}{1:02X}{2:02X}",format_str_01,args_01);
        sVar10 = strlen(color_str_1.field_2._M_local_buf + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&stream.field_0x8,color_str_1.field_2._M_local_buf + 8,sVar10);
        states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)start_state_name.field_2._8_8_;
        local_d8._M_allocated_capacity = (size_type)auStack_58;
        local_d8._8_8_ = color_str_1._M_dataplus._M_p;
        format_str_02.size_ = 0xdd;
        format_str_02.data_ = (char *)0x44;
        args_02.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ = in_R9.values_;
        args_02.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)pppFVar2;
        fmt::v7::detail::vformat_abi_cxx11_
                  ((string *)((long)&color_str.field_2 + 8),
                   (detail *)
                   "node [shape=circle, label=\"{0}\", style=filled, fillcolor=\"{1}\"] {0};",
                   format_str_02,args_02);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&stream.field_0x8,(char *)color_str.field_2._8_8_,
                            (long)pcStack_70);
        std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)color_str.field_2._8_8_ != &local_68) {
          operator_delete((void *)color_str.field_2._8_8_,local_68._M_allocated_capacity + 1);
        }
        uVar15 = start_state_name.field_2._8_8_;
        if (auStack_58 != (undefined1  [8])&color_str_1._M_string_length) {
          operator_delete((void *)auStack_58,color_str_1._M_string_length + 1);
          uVar15 = start_state_name.field_2._8_8_;
        }
      }
      if ((size_type *)uVar15 != &color_str._M_string_length) {
        operator_delete((void *)uVar15,color_str._M_string_length + 1);
      }
      auVar13 = (undefined1  [8])((long)auVar13 + 8);
    } while (auVar13 != (undefined1  [8])ppFVar7);
  }
  cVar6 = (char)&stream.field_0x8;
  std::ios::widen((char)*(undefined8 *)(stream._8_8_ + -0x18) + cVar6);
  std::ostream::put(cVar6);
  std::ostream::flush();
  local_110 = states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
  if (local_100 !=
      (undefined1  [8])
      states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __s = color_str_1.field_2._M_local_buf + 8;
    auVar13 = local_100;
    do {
      pFVar3 = *(FSMState **)auVar13;
      local_118 = (key_type *)auVar13;
      FSMState::handle_name_abi_cxx11_((string *)((long)&start_state_name.field_2 + 8),pFVar3);
      ppVar4 = (pFVar3->transitions_).
               super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (ppVar16 = (pFVar3->transitions_).
                     super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppVar16 != ppVar4;
          ppVar16 = ppVar16 + 1) {
        pVVar5 = ppVar16->first;
        pFVar3 = ppVar16->second;
        sVar10 = strlen(__s);
        if (pVVar5 == (Var *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&stream.field_0x8,__s,sVar10);
          FSMState::handle_name_abi_cxx11_((string *)((long)&color_str.field_2 + 8),pFVar3);
          states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage = (pointer)start_state_name.field_2._8_8_;
          local_d8._M_allocated_capacity = color_str.field_2._8_8_;
          local_d8._8_8_ = pcStack_70;
          format_str_04.size_ = 0xdd;
          format_str_04.data_ = (char *)0xf;
          args_04.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.args_ = in_R9.args_;
          args_04.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)
                   &states.
                    super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
          fmt::v7::detail::vformat_abi_cxx11_
                    ((string *)auStack_58,(detail *)"{0}    ->  {1};",format_str_04,args_04);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&stream.field_0x8,(char *)auStack_58,
                              (long)color_str_1._M_dataplus._M_p);
          std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          sVar14 = color_str_1._M_string_length;
          auVar13 = auStack_58;
          if (auStack_58 != (undefined1  [8])&color_str_1._M_string_length) goto LAB_001cbf57;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&stream.field_0x8,__s,sVar10);
          FSMState::handle_name_abi_cxx11_((string *)((long)&color_str.field_2 + 8),pFVar3);
          (*(pVVar5->super_IRNode)._vptr_IRNode[0x1f])
                    (&state_colors._M_t._M_impl.super__Rb_tree_header._M_node_count,pVVar5);
          states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage = (pointer)start_state_name.field_2._8_8_;
          local_d8._M_allocated_capacity = color_str.field_2._8_8_;
          local_d8._8_8_ = pcStack_70;
          local_c8 = state_colors._M_t._M_impl.super__Rb_tree_header._M_node_count;
          format_str_03.size_ = 0xddd;
          format_str_03.data_ = (char *)0x21;
          args_03.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.args_ = in_R9.args_;
          args_03.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)
                   &states.
                    super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
          fmt::v7::detail::vformat_abi_cxx11_
                    ((string *)auStack_58,(detail *)"{0}    ->  {1} [ label = \"{2}\" ];",
                     format_str_03,args_03);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&stream.field_0x8,(char *)auStack_58,
                              (long)color_str_1._M_dataplus._M_p);
          std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          if (auStack_58 != (undefined1  [8])&color_str_1._M_string_length) {
            operator_delete((void *)auStack_58,color_str_1._M_string_length + 1);
          }
          sVar14 = local_128[0];
          auVar13 = (undefined1  [8])state_colors._M_t._M_impl.super__Rb_tree_header._M_node_count;
          if ((size_type *)state_colors._M_t._M_impl.super__Rb_tree_header._M_node_count !=
              local_128) {
LAB_001cbf57:
            operator_delete((void *)auVar13,sVar14 + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)color_str.field_2._8_8_ != &local_68) {
          operator_delete((void *)color_str.field_2._8_8_,local_68._M_allocated_capacity + 1);
        }
      }
      if ((size_type *)start_state_name.field_2._8_8_ != &color_str._M_string_length) {
        operator_delete((void *)start_state_name.field_2._8_8_,color_str._M_string_length + 1);
      }
      auVar13 = (undefined1  [8])(local_118 + 1);
    } while (auVar13 != (undefined1  [8])local_110);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&stream.field_0x8,"}",1);
  cVar6 = (char)&stream.field_0x8;
  std::ios::widen((char)*(undefined8 *)(stream._8_8_ + -0x18) + cVar6);
  std::ostream::put(cVar6);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::
  _Rb_tree<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_kratos::color::Color>,_std::_Select1st<std::pair<kratos::FSMState_*const,_kratos::color::Color>_>,_std::less<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_kratos::color::Color>_>_>
  ::~_Rb_tree((_Rb_tree<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_kratos::color::Color>,_std::_Select1st<std::pair<kratos::FSMState_*const,_kratos::color::Color>_>,_std::less<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_kratos::color::Color>_>_>
               *)&stream.field_0x180);
  if (local_100 != (undefined1  [8])0x0) {
    operator_delete((void *)local_100,
                    (long)states.
                          super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)local_100);
  }
  if (local_b8 != &start_state_name._M_string_length) {
    operator_delete(local_b8,CONCAT71(start_state_name._M_string_length._1_7_,
                                      (undefined1)start_state_name._M_string_length) + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_2f0);
  std::ios_base::~ios_base((ios_base *)&stream.field_0x78);
  return local_108;
}

Assistant:

std::string FSM::dot_graph() {
    constexpr char indent[] = "    ";  // NOLINT
    std::stringstream stream;

    // header
    stream << "digraph " << fsm_name_ << " {" << endl;
    stream << indent << "rankdir=LR;" << ::endl << ::endl;

    // start state is double circle
    std::string start_state_name;
    if (start_state_) start_state_name = start_state_->handle_name();
    // we include extra states to draw the extra state transition diagram
    auto states = get_all_child_states(true);
    auto state_colors = get_state_color(states);
    if (!start_state_name.empty()) {
        auto color = state_colors.at(start_state_.get());
        auto color_str = ::format("#{0:02X}{1:02X}{2:02X}", color.R, color.G, color.B);
        stream
            << indent
            << ::format(
                   R"(node [shape=doublecircle, label="{0}", style=filled, fillcolor="{1}"] {0};)",
                   start_state_->handle_name(), color_str)
            << ::endl;
    }
    // the rest of the states
    for (auto const& iter : states) {
        auto state_name = iter->handle_name();
        if (state_name == start_state_name) continue;
        auto color = state_colors.at(iter);
        auto color_str = ::format("#{0:02X}{1:02X}{2:02X}", color.R, color.G, color.B);
        stream << indent
               << ::format(
                      R"(node [shape=circle, label="{0}", style=filled, fillcolor="{1}"] {0};)",
                      state_name, color_str)
               << ::endl;
    }

    stream << ::endl;
    // state transition
    for (auto const& state : states) {
        auto const &transitions = state->transitions();
        auto state_name = state->handle_name();
        // deterministic sorting
        for (auto [cond, next_state] : transitions) {
            if (cond) {
                stream << indent
                       << ::format("{0}    ->  {1} [ label = \"{2}\" ];", state_name,
                                   next_state->handle_name(), cond->to_string())
                       << ::endl;
            } else {
                stream << indent
                       << ::format("{0}    ->  {1};", state_name, next_state->handle_name())
                       << ::endl;
            }
        }
    }
    stream << "}" << ::endl;

    return stream.str();
}